

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::ImportPrivKeys
          (LegacyScriptPubKeyMan *this,
          map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
          *privkey_map,int64_t timestamp)

{
  _Base_ptr *this_00;
  long lVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar5;
  _Base_ptr p_Var6;
  size_t sVar7;
  _Rb_tree_header *p_Var8;
  long in_FS_OFFSET;
  Span<const_unsigned_char> s;
  WalletBatch local_b0;
  string local_a0;
  CPubKey pubkey;
  WalletDatabase *pWVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->_vptr_WalletStorage[3])
                    ();
  pWVar4 = (WalletDatabase *)CONCAT44(extraout_var,iVar3);
  (*pWVar4->_vptr_WalletDatabase[0xe])(&local_b0,pWVar4,1);
  p_Var8 = &(privkey_map->_M_t)._M_impl.super__Rb_tree_header;
  local_b0.m_database = pWVar4;
  for (p_Var6 = (privkey_map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var8;
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var6)) {
    this_00 = &p_Var6[1]._M_right;
    CKey::GetPubKey(&pubkey,(CKey *)this_00);
    bVar2 = CKey::VerifyPubKey((CKey *)this_00,&pubkey);
    if (!bVar2) {
      __assert_fail("key.VerifyPubKey(pubkey)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
                    ,0x65d,
                    "bool wallet::LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey> &, const int64_t)"
                   );
    }
    iVar3 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0x1d])
                      (this,p_Var6 + 1);
    if ((char)iVar3 == '\0') {
      pmVar5 = std::
               map<CKeyID,_wallet::CKeyMetadata,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_wallet::CKeyMetadata>_>_>
               ::operator[](&(this->super_LegacyDataSPKM).mapKeyMetadata,(key_type *)(p_Var6 + 1));
      pmVar5->nCreateTime = timestamp;
      bVar2 = AddKeyPubKeyWithDB(this,&local_b0,(CKey *)this_00,&pubkey);
      if (!bVar2) break;
      UpdateTimeFirstKey(this,timestamp);
    }
    else {
      sVar7 = 0x21;
      if ((pubkey.vch[0] & 0xfe) != 2) {
        if ((byte)(pubkey.vch[0] - 4) < 4) {
          sVar7 = *(size_t *)(&DAT_006beed0 + (ulong)(byte)(pubkey.vch[0] - 4) * 8);
        }
        else {
          sVar7 = 0;
        }
      }
      s.m_size = sVar7;
      s.m_data = pubkey.vch;
      HexStr_abi_cxx11_(&local_a0,s);
      ScriptPubKeyMan::WalletLogPrintf<std::__cxx11::string>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<1U>)0x6dfa6e,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
    }
  }
  if (local_b0.m_batch._M_t.
      super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>._M_t
      .super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>.
      super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0) {
    (**(code **)(*(long *)local_b0.m_batch._M_t.
                          super___uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_wallet::DatabaseBatch_*,_std::default_delete<wallet::DatabaseBatch>_>
                          .super__Head_base<0UL,_wallet::DatabaseBatch_*,_false>._M_head_impl + 0x28
                ))();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (_Rb_tree_header *)p_Var6 == p_Var8;
  }
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::ImportPrivKeys(const std::map<CKeyID, CKey>& privkey_map, const int64_t timestamp)
{
    WalletBatch batch(m_storage.GetDatabase());
    for (const auto& entry : privkey_map) {
        const CKey& key = entry.second;
        CPubKey pubkey = key.GetPubKey();
        const CKeyID& id = entry.first;
        assert(key.VerifyPubKey(pubkey));
        // Skip if we already have the key
        if (HaveKey(id)) {
            WalletLogPrintf("Already have key with pubkey %s, skipping\n", HexStr(pubkey));
            continue;
        }
        mapKeyMetadata[id].nCreateTime = timestamp;
        // If the private key is not present in the wallet, insert it.
        if (!AddKeyPubKeyWithDB(batch, key, pubkey)) {
            return false;
        }
        UpdateTimeFirstKey(timestamp);
    }
    return true;
}